

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_create_list2(lysc_node *schema,char *keys,size_t keys_len,ly_bool store_only,
                       lyd_node **node)

{
  LY_ERR LVar1;
  ly_path_predicate *predicates;
  uint32_t exp_idx;
  lyxp_expr *expr;
  
  expr = (lyxp_expr *)0x0;
  exp_idx = 0;
  predicates = (ly_path_predicate *)0x0;
  ly_log_location(schema,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  LVar1 = ly_path_parse_predicate
                    (schema->module->ctx,(lysc_node *)0x0,keys,keys_len,0x10,0x100,&expr);
  if (LVar1 == LY_SUCCESS) {
    LVar1 = ly_path_compile_predicate
                      (schema->module->ctx,(lysc_node *)0x0,(lys_module *)0x0,schema,expr,&exp_idx,
                       LY_VALUE_JSON,(void *)0x0,&predicates);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = lyd_create_list(schema,predicates,(lyxp_var *)0x0,store_only,node);
    }
  }
  ly_log_location_revert(1,0,0,0);
  lyxp_expr_free(schema->module->ctx,expr);
  ly_path_predicates_free(schema->module->ctx,predicates);
  return LVar1;
}

Assistant:

LY_ERR
lyd_create_list2(const struct lysc_node *schema, const char *keys, size_t keys_len, ly_bool store_only, struct lyd_node **node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr = NULL;
    uint32_t exp_idx = 0;
    struct ly_path_predicate *predicates = NULL;

    LOG_LOCSET(schema, NULL);

    /* parse keys */
    LY_CHECK_GOTO(ret = ly_path_parse_predicate(schema->module->ctx, NULL, keys, keys_len, LY_PATH_PREFIX_OPTIONAL,
            LY_PATH_PRED_KEYS, &expr), cleanup);

    /* compile them */
    LY_CHECK_GOTO(ret = ly_path_compile_predicate(schema->module->ctx, NULL, NULL, schema, expr, &exp_idx, LY_VALUE_JSON,
            NULL, &predicates), cleanup);

    /* create the list node */
    LY_CHECK_GOTO(ret = lyd_create_list(schema, predicates, NULL, store_only, node), cleanup);

cleanup:
    LOG_LOCBACK(1, 0);
    lyxp_expr_free(schema->module->ctx, expr);
    ly_path_predicates_free(schema->module->ctx, predicates);
    return ret;
}